

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# halfEdgeMesh.cpp
# Opt level: O0

void __thiscall CMU462::Edge::translate(Edge *this,double dx,double dy,Matrix4x4 *modelViewProj)

{
  bool bVar1;
  HalfedgeIter *pHVar2;
  pointer pHVar3;
  Edge *in_RDI;
  HalfedgeIter h;
  Matrix4x4 *in_stack_000000c0;
  double in_stack_000000c8;
  double in_stack_000000d0;
  Vector3D *in_stack_000000d8;
  HalfedgeElement *in_stack_000000e0;
  _Self local_28 [5];
  
  pHVar2 = halfedge(in_RDI);
  local_28[0]._M_node = pHVar2->_M_node;
  do {
    pHVar3 = std::_List_iterator<CMU462::Halfedge>::operator->
                       ((_List_iterator<CMU462::Halfedge> *)in_RDI);
    Halfedge::vertex(pHVar3);
    std::_List_iterator<CMU462::Vertex>::operator->((_List_iterator<CMU462::Vertex> *)in_RDI);
    HalfedgeElement::translatePoint
              (in_stack_000000e0,in_stack_000000d8,in_stack_000000d0,in_stack_000000c8,
               in_stack_000000c0);
    pHVar3 = std::_List_iterator<CMU462::Halfedge>::operator->
                       ((_List_iterator<CMU462::Halfedge> *)in_RDI);
    pHVar2 = Halfedge::twin(pHVar3);
    local_28[0]._M_node = pHVar2->_M_node;
    pHVar2 = halfedge(in_RDI);
    bVar1 = std::operator!=(local_28,pHVar2);
  } while (bVar1);
  return;
}

Assistant:

void Edge::translate(double dx, double dy, const Matrix4x4& modelViewProj) {
  HalfedgeIter h = halfedge();
  do {
    translatePoint(h->vertex()->position, dx, dy, modelViewProj);
    h = h->twin();
  } while (h != halfedge());
}